

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegionSection *
memory_region_find_sparc64
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion *mr,hwaddr addr,uint64_t size)

{
  AddressSpace *pAVar1;
  FlatRange *pFVar2;
  undefined1 a [16];
  undefined1 a_00 [16];
  AddrRange r1;
  AddrRange r1_00;
  AddrRange r2;
  AddrRange r2_00;
  _Bool _Var3;
  FlatRange *pFVar4;
  FlatView *pFVar5;
  MemoryRegion *pMVar6;
  uint64_t uVar7;
  anon_union_16_2_aaf24f3d_for_address_spaces_link *paVar8;
  MemoryRegion *pMVar9;
  hwaddr hVar10;
  hwaddr hVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 in_stack_ffffffffffffff88;
  hwaddr local_58 [2];
  uint64_t local_48;
  undefined8 uStack_40;
  
  do {
    pMVar6 = mr;
    addr = addr + pMVar6->addr;
    mr = pMVar6->container;
  } while (pMVar6->container != (MemoryRegion *)0x0);
  do {
    pMVar9 = pMVar6;
    pMVar6 = pMVar9->container;
  } while (pMVar9->container != (MemoryRegion *)0x0);
  paVar8 = (anon_union_16_2_aaf24f3d_for_address_spaces_link *)&pMVar9->uc->address_spaces;
  while (pAVar1 = paVar8->tqe_next, pAVar1 != (AddressSpace *)0x0) {
    if (pMVar9 == (MemoryRegion *)pAVar1->root) {
      uVar12 = 0;
      uVar13 = 0;
      pFVar5 = pAVar1->current_map;
      uStack_40 = 0;
      local_58[1] = 0;
      local_58[0] = addr;
      local_48 = size;
      pFVar4 = (FlatRange *)
               bsearch(local_58,pFVar5->ranges,(ulong)pFVar5->nr,0x40,cmp_flatrange_addr);
      if (pFVar4 != (FlatRange *)0x0) {
        pFVar2 = pFVar5->ranges;
        goto LAB_008dfb9c;
      }
      break;
    }
    paVar8 = &pAVar1->address_spaces_link;
  }
  uVar7 = 0;
  uVar13 = 0;
  pMVar6 = (MemoryRegion *)0x0;
  pFVar5 = (FlatView *)0x0;
  hVar11 = 0;
  hVar10 = 0;
  _Var3 = false;
LAB_008dfc84:
  *(uint64_t *)&__return_storage_ptr__->size = uVar7;
  *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = uVar13;
  __return_storage_ptr__->mr = pMVar6;
  __return_storage_ptr__->fv = pFVar5;
  __return_storage_ptr__->offset_within_region = hVar11;
  __return_storage_ptr__->offset_within_address_space = hVar10;
  __return_storage_ptr__->readonly = _Var3;
  *(undefined8 *)&__return_storage_ptr__->field_0x31 = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
  return __return_storage_ptr__;
LAB_008dfb9c:
  if (pFVar4 <= pFVar2) goto LAB_008dfbed;
  r1_00.start._8_8_ = size;
  r1_00.start._0_8_ = uVar12;
  r1_00.size._0_8_ = uVar13;
  r1_00.size._8_8_ = addr;
  r2_00.start._8_8_ = size;
  r2_00.start._0_8_ = uVar12;
  r2_00.size._0_8_ = uVar13;
  r2_00.size._8_8_ = in_stack_ffffffffffffff88;
  _Var3 = addrrange_intersects(r1_00,r2_00);
  if (!_Var3) goto LAB_008dfbed;
  pFVar4 = pFVar4 + -1;
  goto LAB_008dfb9c;
LAB_008dfbed:
  pMVar6 = pFVar4->mr;
  r1.start._8_8_ = (long)(pFVar4->addr).start;
  r1.start._0_8_ = uVar13;
  r1.size._0_8_ = *(undefined8 *)((long)&(pFVar4->addr).start + 8);
  r1.size._8_8_ = (long)(pFVar4->addr).size;
  r2.start._8_8_ = addr;
  r2.start._0_8_ = *(undefined8 *)((long)&(pFVar4->addr).size + 8);
  r2.size._0_8_ = uVar12;
  r2.size._8_8_ = size;
  addrrange_intersection(r1,r2);
  hVar10 = local_58[0];
  hVar11 = (local_58[0] - (long)(pFVar4->addr).start) + pFVar4->offset_in_region;
  a._8_8_ = uVar12;
  a._0_8_ = addr;
  uVar7 = local_48;
  uVar13 = uStack_40;
  int128_get64((Int128)a);
  a_00._8_8_ = uVar12;
  a_00._0_8_ = addr;
  int128_get64((Int128)a_00);
  _Var3 = pFVar4->readonly;
  goto LAB_008dfc84;
}

Assistant:

MemoryRegionSection memory_region_find(MemoryRegion *mr,
                                       hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret;

    ret = memory_region_find_rcu(mr, addr, size);
    return ret;
}